

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O1

void FAudio_INTERNAL_DecodePCM16
               (FAudioVoice *voice,FAudioBuffer *buffer,float *decodeCache,uint32_t samples)

{
  uint uVar1;
  
  uVar1 = (uint)((voice->field_19).src.format)->nChannels;
  (*FAudio_INTERNAL_Convert_S16_To_F32)
            ((int16_t *)
             (buffer->pAudioData + (ulong)((voice->field_19).src.curBufferOffset * uVar1) * 2),
             decodeCache,uVar1 * samples);
  return;
}

Assistant:

void FAudio_INTERNAL_DecodePCM16(
	FAudioVoice *voice,
	FAudioBuffer *buffer,
	float *decodeCache,
	uint32_t samples
) {
	LOG_FUNC_ENTER(voice->audio)
	FAudio_INTERNAL_Convert_S16_To_F32(
		((int16_t*) buffer->pAudioData) + (
			voice->src.curBufferOffset * voice->src.format->nChannels
		),
		decodeCache,
		samples * voice->src.format->nChannels
	);
	LOG_FUNC_EXIT(voice->audio)
}